

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type pSVar4;
  Type pSVar5;
  int local_20;
  int local_1c;
  int j;
  int index_local;
  List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *list_local;
  CopyRemovePolicy<JsUtil::List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  *this_local;
  
  if ((index < 0) ||
     ((list->
      super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
      ).count <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_1c = index;
  for (local_20 = index + 1;
      local_20 <
      (list->
      super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
      ).count; local_20 = local_20 + 1) {
    pSVar5 = (list->
             super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
             ).buffer + local_20;
    pSVar4 = (list->
             super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
             ).buffer + local_1c;
    pSVar4->node = pSVar5->node;
    pSVar4->beginCodeSpan = pSVar5->beginCodeSpan;
    local_1c = local_1c + 1;
  }
  (list->
  super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
  ).count = (list->
            super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
            ).count + -1;
  Memory::ClearArray<Js::ByteCodeWriter::SubexpressionNode>
            ((list->
             super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
             ).buffer +
             (list->
             super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
             ).count,1);
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }